

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkTSDA::IntStateGather
          (ChLinkTSDA *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  Index size;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  iVar12 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if (((char)iVar12 == '\0') || (this->m_variables == (ChVariablesGenericDiagonalMass *)0x0)) {
    return;
  }
  uVar19 = (ulong)this->m_nstates;
  pdVar3 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar3 != (double *)0x0 && (long)uVar19 < 0) {
LAB_005a9c7b:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((-1 < this->m_nstates) &&
     ((long)(ulong)off_x <=
      (long)((x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            uVar19))) {
    pdVar3 = pdVar3 + off_x;
    uVar14 = uVar19;
    if ((((ulong)pdVar3 & 7) == 0) &&
       (uVar14 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
       (long)uVar19 <= (long)uVar14)) {
      uVar14 = uVar19;
    }
    uVar18 = uVar19 - uVar14;
    uVar16 = uVar18 + 7;
    if (-1 < (long)uVar18) {
      uVar16 = uVar18;
    }
    if (0 < (long)uVar14) {
      memset(pdVar3,0,uVar14 * 8);
    }
    lVar15 = (uVar16 & 0xfffffffffffffff8) + uVar14;
    if (7 < (long)uVar18) {
      lVar13 = uVar14 + 8;
      if ((long)(uVar14 + 8) < lVar15) {
        lVar13 = lVar15;
      }
      memset(pdVar3 + uVar14,0,(~uVar14 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (uVar19 - lVar15 != 0 && lVar15 <= (long)uVar19) {
      memset(pdVar3 + ((long)uVar16 >> 3) * 8 + uVar14,0,(uVar19 - lVar15) * 8);
    }
    uVar19 = (ulong)this->m_nstates;
    pdVar3 = (v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if (pdVar3 != (double *)0x0 && (long)uVar19 < 0) goto LAB_005a9c7b;
    if ((-1 < this->m_nstates) &&
       ((long)(ulong)off_v <=
        (long)((v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar19))) {
      if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows == uVar19) {
        pdVar3 = pdVar3 + off_v;
        uVar14 = uVar19;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar14 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
           (long)uVar19 <= (long)uVar14)) {
          uVar14 = uVar19;
        }
        pdVar4 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar18 = uVar19 - uVar14;
        uVar16 = uVar18 + 7;
        if (-1 < (long)uVar18) {
          uVar16 = uVar18;
        }
        if (0 < (long)uVar14) {
          uVar17 = 0;
          do {
            pdVar3[uVar17] = pdVar4[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar16 = (uVar16 & 0xfffffffffffffff8) + uVar14;
        if (7 < (long)uVar18) {
          do {
            pdVar1 = pdVar4 + uVar14;
            dVar5 = pdVar1[1];
            dVar6 = pdVar1[2];
            dVar7 = pdVar1[3];
            dVar8 = pdVar1[4];
            dVar9 = pdVar1[5];
            dVar10 = pdVar1[6];
            dVar11 = pdVar1[7];
            pdVar2 = pdVar3 + uVar14;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar5;
            pdVar2[2] = dVar6;
            pdVar2[3] = dVar7;
            pdVar2[4] = dVar8;
            pdVar2[5] = dVar9;
            pdVar2[6] = dVar10;
            pdVar2[7] = dVar11;
            uVar14 = uVar14 + 8;
          } while ((long)uVar14 < (long)uVar16);
        }
        if ((long)uVar16 < (long)uVar19) {
          do {
            pdVar3[uVar16] = pdVar4[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
        }
        *T = (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
        return;
      }
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkTSDA::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                ChState& x,                // state vector, position part
                                const unsigned int off_v,  // offset in v state vector
                                ChStateDelta& v,           // state vector, speed part
                                double& T                  // time
) {
    if (!IsActive())
        return;

    if (m_variables) {
        x.segment(off_x, m_nstates).setZero();
        v.segment(off_v, m_nstates) = m_states;
        T = GetChTime();
    }
}